

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O2

void tcg_gen_muli_i32_mips64el
               (TCGContext_conflict6 *tcg_ctx,TCGv_i32 ret,TCGv_i32 arg1,int32_t arg2)

{
  int32_t arg2_00;
  uintptr_t o_2;
  TCGv_i32 pTVar1;
  TCGOp *pTVar2;
  uintptr_t o_1;
  uintptr_t o;
  
  if (arg2 == 0) {
    tcg_gen_movi_i32(tcg_ctx,ret,0);
    return;
  }
  if (((long)arg2 & (long)arg2 - 1U) == 0) {
    arg2_00 = 0;
    if (arg2 != 0) {
      for (; ((uint)arg2 >> arg2_00 & 1) == 0; arg2_00 = arg2_00 + 1) {
      }
    }
    tcg_gen_shli_i32_mips64el(tcg_ctx,ret,arg1,arg2_00);
    return;
  }
  pTVar1 = tcg_const_i32_mips64el(tcg_ctx,arg2);
  pTVar2 = tcg_emit_op_mips64el(tcg_ctx,INDEX_op_mul_i32);
  pTVar2->args[0] = (TCGArg)(ret + (long)tcg_ctx);
  pTVar2->args[1] = (TCGArg)(arg1 + (long)tcg_ctx);
  pTVar2->args[2] = (TCGArg)(pTVar1 + (long)tcg_ctx);
  tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(pTVar1 + (long)tcg_ctx));
  return;
}

Assistant:

void tcg_gen_muli_i32(TCGContext *tcg_ctx, TCGv_i32 ret, TCGv_i32 arg1, int32_t arg2)
{
    if (arg2 == 0) {
        tcg_gen_movi_i32(tcg_ctx, ret, 0);
    } else if (is_power_of_2(arg2)) {
        tcg_gen_shli_i32(tcg_ctx, ret, arg1, ctz32(arg2));
    } else {
        TCGv_i32 t0 = tcg_const_i32(tcg_ctx, arg2);
        tcg_gen_mul_i32(tcg_ctx, ret, arg1, t0);
        tcg_temp_free_i32(tcg_ctx, t0);
    }
}